

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

cmComputeLinkInformation * __thiscall
cmGeneratorTarget::GetLinkInformation(cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  iterator iVar2;
  cmComputeLinkInformation *pcVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation_*>_>,_bool>
  pVar4;
  string key;
  value_type entry;
  string local_70;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation_*>
  local_50;
  
  cmsys::SystemTools::UpperCase(&local_70,config);
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation_*>_>_>
          ::find(&(this->LinkInformation)._M_t,&local_70);
  if ((_Rb_tree_header *)iVar2._M_node ==
      &(this->LinkInformation)._M_t._M_impl.super__Rb_tree_header) {
    pcVar3 = (cmComputeLinkInformation *)operator_new(0x778);
    cmComputeLinkInformation::cmComputeLinkInformation(pcVar3,this,config);
    bVar1 = cmComputeLinkInformation::Compute(pcVar3);
    if (!bVar1) {
      cmComputeLinkInformation::~cmComputeLinkInformation(pcVar3);
      operator_delete(pcVar3,0x778);
      pcVar3 = (cmComputeLinkInformation *)0x0;
    }
    std::__cxx11::string::string((string *)&local_50,(string *)&local_70);
    local_50.second = pcVar3;
    pVar4 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation*>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string_const,cmComputeLinkInformation*>&>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation*>>>
                        *)&this->LinkInformation,&local_50);
    iVar2._M_node = (_Base_ptr)pVar4.first._M_node;
    if (pcVar3 != (cmComputeLinkInformation *)0x0) {
      CheckPropertyCompatibility(this,pcVar3,config);
    }
    std::__cxx11::string::~string((string *)&local_50);
  }
  pcVar3 = *(cmComputeLinkInformation **)(iVar2._M_node + 2);
  std::__cxx11::string::~string((string *)&local_70);
  return pcVar3;
}

Assistant:

cmComputeLinkInformation* cmGeneratorTarget::GetLinkInformation(
  const std::string& config) const
{
  // Lookup any existing information for this configuration.
  std::string key(cmSystemTools::UpperCase(config));
  cmTargetLinkInformationMap::iterator i = this->LinkInformation.find(key);
  if (i == this->LinkInformation.end()) {
    // Compute information for this configuration.
    cmComputeLinkInformation* info =
      new cmComputeLinkInformation(this, config);
    if (!info || !info->Compute()) {
      delete info;
      info = nullptr;
    }

    // Store the information for this configuration.
    cmTargetLinkInformationMap::value_type entry(key, info);
    i = this->LinkInformation.insert(entry).first;

    if (info) {
      this->CheckPropertyCompatibility(info, config);
    }
  }
  return i->second;
}